

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

Blob<128> bitreverse<Blob<128>>(Blob<128> *n,size_t b)

{
  uint8_t k;
  int iVar1;
  ulong in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  Blob<128> *in_RSI;
  Blob<128> *in_RDI;
  Blob<128> BVar3;
  size_t i;
  Blob<128> *rv;
  int c;
  Blob<128> *this;
  undefined8 local_20;
  
  this = in_RDI;
  Blob<128>::Blob(in_RDI,0);
  uVar2 = extraout_RDX;
  for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 8) {
    c = (int)((ulong)in_RSI >> 0x20);
    Blob<128>::operator<<=(this,c);
    iVar1 = Blob<128>::operator&(in_RSI,0xff);
    k = bitrev((uint8_t)iVar1);
    Blob<128>::operator|=(this,k);
    Blob<128>::operator>>=(this,c);
    uVar2 = extraout_RDX_00;
  }
  BVar3.bytes[8] = (char)uVar2;
  BVar3.bytes[9] = (char)((ulong)uVar2 >> 8);
  BVar3.bytes[10] = (char)((ulong)uVar2 >> 0x10);
  BVar3.bytes[0xb] = (char)((ulong)uVar2 >> 0x18);
  BVar3.bytes[0xc] = (char)((ulong)uVar2 >> 0x20);
  BVar3.bytes[0xd] = (char)((ulong)uVar2 >> 0x28);
  BVar3.bytes[0xe] = (char)((ulong)uVar2 >> 0x30);
  BVar3.bytes[0xf] = (char)((ulong)uVar2 >> 0x38);
  BVar3.bytes._0_8_ = in_RDI;
  return (Blob<128>)BVar3.bytes;
}

Assistant:

hashtype bitreverse(hashtype n, size_t b = sizeof(hashtype) * 8)
{
    assert(b <= std::numeric_limits<hashtype>::digits);
    hashtype rv = 0;
    for (size_t i = 0; i < b; i += 8) {
        rv <<= 8;
        rv |= bitrev(n & 0xff); // ensure overloaded |= op for Blob not underflowing
        n >>= 8;
    }
    return rv;
}